

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_import.c
# Opt level: O0

REF_STATUS
ref_import_meshb_contents(char *filename,REF_BOOL *has_association,REF_BOOL *has_geometry_model)

{
  bool local_52d;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT cad_data_keyword;
  REF_INT face_keyword;
  REF_INT edge_keyword;
  REF_INT node_keyword;
  REF_FILEPOS key_pos [156];
  REF_INT local_2c;
  uint *puStack_28;
  REF_INT version;
  REF_BOOL *has_geometry_model_local;
  REF_BOOL *has_association_local;
  char *filename_local;
  
  puStack_28 = (uint *)has_geometry_model;
  has_geometry_model_local = has_association;
  has_association_local = (REF_BOOL *)filename;
  filename_local._4_4_ = ref_import_meshb_header(filename,&local_2c,(REF_FILEPOS *)&edge_keyword);
  if (filename_local._4_4_ == 0) {
    local_52d = true;
    if ((key_pos[0x27] == -1) && (local_52d = true, key_pos[0x28] == -1)) {
      local_52d = key_pos[0x29] != -1;
    }
    *has_geometry_model_local = (uint)local_52d;
    *puStack_28 = (uint)(key_pos[0x7d] != -1);
    filename_local._4_4_ = 0;
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c",0x5f4,
           "ref_import_meshb_contents",(ulong)filename_local._4_4_,"header");
  }
  return filename_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_import_meshb_contents(const char *filename,
                                             REF_BOOL *has_association,
                                             REF_BOOL *has_geometry_model) {
  REF_INT version;
  REF_FILEPOS key_pos[REF_IMPORT_MESHB_LAST_KEYWORD];
  REF_INT node_keyword = 40;
  REF_INT edge_keyword = 41;
  REF_INT face_keyword = 42;
  REF_INT cad_data_keyword = 126; /* GmfByteFlow */
  RSS(ref_import_meshb_header(filename, &version, key_pos), "header");
  *has_association = ((REF_FILEPOS)REF_EMPTY != key_pos[node_keyword]) ||
                     ((REF_FILEPOS)REF_EMPTY != key_pos[edge_keyword]) ||
                     ((REF_FILEPOS)REF_EMPTY != key_pos[face_keyword]);
  *has_geometry_model = ((REF_FILEPOS)REF_EMPTY != key_pos[cad_data_keyword]);
  return REF_SUCCESS;
}